

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersector1<4,_1,_true,_embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  int iVar15;
  ulong uVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  Geometry *pGVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined8 uVar28;
  int iVar29;
  undefined1 (*pauVar30) [16];
  undefined4 uVar31;
  undefined4 uVar32;
  RTCIntersectArguments *pRVar33;
  float *pfVar34;
  RTCIntersectArguments *pRVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  undefined1 auVar39 [8];
  ulong uVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  undefined1 (*pauVar43) [16];
  ulong uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  float fVar57;
  float fVar58;
  float fVar72;
  float fVar73;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar90;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar91;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar112;
  float fVar113;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar114;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar124;
  float fVar128;
  float fVar129;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar130;
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  float fVar140;
  undefined1 auVar139 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [16];
  float fVar160;
  undefined1 auVar154 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  uint local_1438;
  uint uStack_1434;
  uint uStack_1430;
  uint uStack_142c;
  int local_141c;
  undefined8 local_1418;
  float fStack_1410;
  float fStack_140c;
  float local_1408;
  float fStack_1404;
  float fStack_1400;
  float fStack_13fc;
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [8];
  float fStack_13e0;
  float fStack_13dc;
  ulong local_13d0;
  RayHit *local_13c8;
  RayQueryContext *local_13c0;
  long local_13b8;
  ulong local_13b0;
  RTCFilterFunctionNArguments local_13a8;
  undefined8 local_1378;
  float fStack_1370;
  float fStack_136c;
  float local_1368;
  float local_1364;
  undefined4 local_1360;
  float local_135c;
  float local_1358;
  undefined4 local_1354;
  uint local_1350;
  uint local_134c;
  uint local_1348;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  undefined8 local_1318;
  float fStack_1310;
  float fStack_130c;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  undefined8 local_12d8;
  float fStack_12d0;
  float fStack_12cc;
  float local_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [16];
  undefined1 local_1288 [8];
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  undefined1 local_1268 [8];
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [16];
  float local_1248;
  uint uStack_1244;
  uint uStack_1240;
  uint uStack_123c;
  undefined1 local_1238 [16];
  float local_1228 [4];
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  float local_1208 [4];
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  uint local_11e8;
  uint uStack_11e4;
  uint uStack_11e0;
  uint uStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  long local_11a0;
  long local_1198;
  Scene *local_1190;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar42 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar57 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar58 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar72 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar73 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar14 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar138 = (ray->super_RayK<1>).tfar;
    fVar140 = 0.0;
    if (0.0 <= fVar138) {
      fVar140 = fVar138;
    }
    uVar45 = -(uint)(1e-18 <= ABS(aVar14.x));
    uVar46 = -(uint)(1e-18 <= ABS(aVar14.y));
    uVar50 = -(uint)(1e-18 <= ABS(aVar14.z));
    auVar115 = divps(_DAT_01f46a60,(undefined1  [16])aVar14);
    fVar141 = (float)(~uVar45 & 0x5d5e0b6b | auVar115._0_4_ & uVar45);
    fVar143 = (float)(~uVar46 & 0x5d5e0b6b | auVar115._4_4_ & uVar46);
    fVar145 = (float)(~uVar50 & 0x5d5e0b6b | auVar115._8_4_ & uVar50);
    fVar152 = fVar141 * 0.99999964;
    fVar155 = fVar143 * 0.99999964;
    fVar157 = fVar145 * 0.99999964;
    fVar141 = fVar141 * 1.0000004;
    fVar143 = fVar143 * 1.0000004;
    fVar145 = fVar145 * 1.0000004;
    fVar138 = 0.0;
    if (0.0 <= fVar73) {
      fVar138 = fVar73;
    }
    uVar41 = (ulong)(fVar152 < 0.0) << 4;
    uVar40 = (ulong)(fVar155 < 0.0) << 4 | 0x20;
    uVar38 = (ulong)(fVar157 < 0.0) << 4 | 0x40;
    uVar36 = uVar41 ^ 0x10;
    auVar115._4_4_ = fVar140;
    auVar115._0_4_ = fVar140;
    auVar115._8_4_ = fVar140;
    auVar115._12_4_ = fVar140;
    auVar74._8_4_ = 0xffffffff;
    auVar74._0_8_ = 0xffffffffffffffff;
    auVar74._12_4_ = 0xffffffff;
    local_10c8 = mm_lookupmask_ps._0_16_;
    local_10f8 = mm_lookupmask_ps._0_16_ ^ auVar74;
    local_10d8 = mm_lookupmask_ps._240_16_;
    local_10e8 = auVar74 ^ mm_lookupmask_ps._240_16_;
    local_13c0 = context;
    local_13c8 = ray;
    local_13d0 = uVar41;
    local_13b0 = uVar36;
    local_1058 = fVar72;
    fStack_1054 = fVar72;
    fStack_1050 = fVar72;
    fStack_104c = fVar72;
    local_1068 = fVar145;
    fStack_1064 = fVar145;
    fStack_1060 = fVar145;
    fStack_105c = fVar145;
    local_1078 = fVar138;
    fStack_1074 = fVar138;
    fStack_1070 = fVar138;
    fStack_106c = fVar138;
    local_1088 = fVar157;
    fStack_1084 = fVar157;
    fStack_1080 = fVar157;
    fStack_107c = fVar157;
    local_1098 = fVar57;
    fStack_1094 = fVar57;
    fStack_1090 = fVar57;
    fStack_108c = fVar57;
    local_10a8 = fVar58;
    fStack_10a4 = fVar58;
    fStack_10a0 = fVar58;
    fStack_109c = fVar58;
    local_10b8 = fVar152;
    fStack_10b4 = fVar152;
    fStack_10b0 = fVar152;
    fStack_10ac = fVar152;
    local_1178 = fVar155;
    fStack_1174 = fVar155;
    fStack_1170 = fVar155;
    fStack_116c = fVar155;
    local_1188 = fVar141;
    fStack_1184 = fVar141;
    fStack_1180 = fVar141;
    fStack_117c = fVar141;
    local_11d8 = fVar143;
    fStack_11d4 = fVar143;
    fStack_11d0 = fVar143;
    fStack_11cc = fVar143;
    fVar140 = fVar138;
    fVar73 = fVar138;
    fVar90 = fVar138;
    fVar91 = fVar57;
    fVar102 = fVar57;
    fVar112 = fVar57;
    fVar113 = fVar58;
    fVar114 = fVar58;
    fVar124 = fVar58;
    fVar128 = fVar152;
    fVar129 = fVar152;
    fVar130 = fVar152;
    fVar142 = fVar143;
    fVar144 = fVar143;
    fVar146 = fVar143;
    fVar147 = fVar155;
    fVar148 = fVar155;
    fVar149 = fVar155;
    fVar150 = fVar141;
    fVar151 = fVar141;
    fVar160 = fVar141;
    fVar161 = fVar72;
    fVar162 = fVar72;
    fVar163 = fVar72;
    fVar164 = fVar145;
    fVar165 = fVar145;
    fVar166 = fVar145;
    fVar156 = fVar157;
    fVar158 = fVar157;
    fVar159 = fVar157;
LAB_00582c81:
    if (pauVar42 != (undefined1 (*) [16])&local_f78) {
      pauVar30 = pauVar42 + -1;
      pauVar42 = pauVar42 + -1;
      pfVar13 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar30 + 8) < *pfVar13 || *(float *)((long)*pauVar30 + 8) == *pfVar13)
      {
        pauVar30 = (undefined1 (*) [16])&local_f78;
        pauVar43 = *(undefined1 (**) [16])*pauVar42;
        while (((ulong)pauVar43 & 8) == 0) {
          pfVar13 = (float *)((long)pauVar43[2] + uVar41);
          auVar119._0_4_ = (*pfVar13 - fVar57) * fVar152;
          auVar119._4_4_ = (pfVar13[1] - fVar91) * fVar128;
          auVar119._8_4_ = (pfVar13[2] - fVar102) * fVar129;
          auVar119._12_4_ = (pfVar13[3] - fVar112) * fVar130;
          pfVar13 = (float *)((long)pauVar43[2] + uVar40);
          auVar132._0_4_ = (*pfVar13 - fVar58) * fVar155;
          auVar132._4_4_ = (pfVar13[1] - fVar113) * fVar147;
          auVar132._8_4_ = (pfVar13[2] - fVar114) * fVar148;
          auVar132._12_4_ = (pfVar13[3] - fVar124) * fVar149;
          auVar74 = maxps(auVar119,auVar132);
          pfVar13 = (float *)((long)pauVar43[2] + uVar38);
          auVar92._0_4_ = (*pfVar13 - fVar72) * fVar157;
          auVar92._4_4_ = (pfVar13[1] - fVar161) * fVar156;
          auVar92._8_4_ = (pfVar13[2] - fVar162) * fVar158;
          auVar92._12_4_ = (pfVar13[3] - fVar163) * fVar159;
          auVar93._4_4_ = fVar140;
          auVar93._0_4_ = fVar138;
          auVar93._8_4_ = fVar73;
          auVar93._12_4_ = fVar90;
          auVar93 = maxps(auVar92,auVar93);
          _local_12b8 = maxps(auVar74,auVar93);
          pfVar13 = (float *)((long)pauVar43[2] + uVar36);
          auVar94._0_4_ = (*pfVar13 - fVar57) * fVar141;
          auVar94._4_4_ = (pfVar13[1] - fVar91) * fVar150;
          auVar94._8_4_ = (pfVar13[2] - fVar102) * fVar151;
          auVar94._12_4_ = (pfVar13[3] - fVar112) * fVar160;
          pfVar13 = (float *)((long)pauVar43[2] + (uVar40 ^ 0x10));
          auVar103._0_4_ = (*pfVar13 - fVar58) * fVar143;
          auVar103._4_4_ = (pfVar13[1] - fVar113) * fVar142;
          auVar103._8_4_ = (pfVar13[2] - fVar114) * fVar144;
          auVar103._12_4_ = (pfVar13[3] - fVar124) * fVar146;
          auVar74 = minps(auVar94,auVar103);
          pfVar13 = (float *)((long)pauVar43[2] + (uVar38 ^ 0x10));
          auVar104._0_4_ = (*pfVar13 - fVar72) * fVar145;
          auVar104._4_4_ = (pfVar13[1] - fVar161) * fVar164;
          auVar104._8_4_ = (pfVar13[2] - fVar162) * fVar165;
          auVar104._12_4_ = (pfVar13[3] - fVar163) * fVar166;
          auVar93 = minps(auVar104,auVar115);
          auVar74 = minps(auVar74,auVar93);
          auVar126._4_4_ = -(uint)(local_12b8._4_4_ <= auVar74._4_4_);
          auVar126._0_4_ = -(uint)(local_12b8._0_4_ <= auVar74._0_4_);
          auVar126._8_4_ = -(uint)(local_12b8._8_4_ <= auVar74._8_4_);
          auVar126._12_4_ = -(uint)(local_12b8._12_4_ <= auVar74._12_4_);
          uVar45 = movmskps((int)pauVar30,auVar126);
          if (uVar45 == 0) goto LAB_00582c81;
          uVar45 = uVar45 & 0xff;
          uVar44 = (ulong)pauVar43 & 0xfffffffffffffff0;
          lVar37 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          pauVar30 = *(undefined1 (**) [16])(uVar44 + lVar37 * 8);
          uVar45 = uVar45 - 1 & uVar45;
          pauVar43 = pauVar30;
          if (uVar45 != 0) {
            uVar46 = *(uint *)(local_12b8 + lVar37 * 4);
            lVar37 = 0;
            if (uVar45 != 0) {
              for (; (uVar45 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            pauVar43 = *(undefined1 (**) [16])(uVar44 + lVar37 * 8);
            uVar50 = *(uint *)(local_12b8 + lVar37 * 4);
            uVar45 = uVar45 - 1 & uVar45;
            if (uVar45 == 0) {
              if (uVar46 < uVar50) {
                *(undefined1 (**) [16])*pauVar42 = pauVar43;
                *(uint *)((long)*pauVar42 + 8) = uVar50;
                pauVar42 = pauVar42 + 1;
                pauVar43 = pauVar30;
              }
              else {
                *(undefined1 (**) [16])*pauVar42 = pauVar30;
                *(uint *)((long)*pauVar42 + 8) = uVar46;
                pauVar30 = pauVar43;
                pauVar42 = pauVar42 + 1;
              }
            }
            else {
              auVar75._8_4_ = uVar46;
              auVar75._0_8_ = pauVar30;
              auVar75._12_4_ = 0;
              auVar95._8_4_ = uVar50;
              auVar95._0_8_ = pauVar43;
              auVar95._12_4_ = 0;
              lVar37 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              uVar16 = *(ulong *)(uVar44 + lVar37 * 8);
              iVar29 = *(int *)(local_12b8 + lVar37 * 4);
              auVar105._8_4_ = iVar29;
              auVar105._0_8_ = uVar16;
              auVar105._12_4_ = 0;
              auVar116._8_4_ = -(uint)((int)uVar46 < (int)uVar50);
              uVar45 = uVar45 - 1 & uVar45;
              fVar142 = fStack_11d4;
              fVar144 = fStack_11d0;
              fVar146 = fStack_11cc;
              fVar143 = local_11d8;
              if (uVar45 == 0) {
                auVar116._4_4_ = auVar116._8_4_;
                auVar116._0_4_ = auVar116._8_4_;
                auVar116._12_4_ = auVar116._8_4_;
                auVar74 = auVar75 & auVar116 | ~auVar116 & auVar95;
                auVar93 = auVar95 & auVar116 | ~auVar116 & auVar75;
                auVar117._8_4_ = -(uint)(auVar74._8_4_ < iVar29);
                auVar117._0_8_ = CONCAT44(auVar117._8_4_,auVar117._8_4_);
                auVar117._12_4_ = auVar117._8_4_;
                pauVar30 = (undefined1 (*) [16])
                           (~auVar117._0_8_ & uVar16 | auVar74._0_8_ & auVar117._0_8_);
                auVar74 = auVar105 & auVar117 | ~auVar117 & auVar74;
                auVar76._8_4_ = -(uint)(auVar93._8_4_ < auVar74._8_4_);
                auVar76._4_4_ = auVar76._8_4_;
                auVar76._0_4_ = auVar76._8_4_;
                auVar76._12_4_ = auVar76._8_4_;
                *pauVar42 = ~auVar76 & auVar93 | auVar74 & auVar76;
                pauVar42[1] = auVar93 & auVar76 | ~auVar76 & auVar74;
                pauVar42 = pauVar42 + 2;
                pauVar43 = pauVar30;
              }
              else {
                lVar37 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                  }
                }
                iVar15 = *(int *)(local_12b8 + lVar37 * 4);
                auVar125._8_4_ = iVar15;
                auVar125._0_8_ = *(undefined8 *)(uVar44 + lVar37 * 8);
                auVar125._12_4_ = 0;
                auVar118._4_4_ = auVar116._8_4_;
                auVar118._0_4_ = auVar116._8_4_;
                auVar118._8_4_ = auVar116._8_4_;
                auVar118._12_4_ = auVar116._8_4_;
                auVar74 = auVar75 & auVar118 | ~auVar118 & auVar95;
                auVar93 = auVar95 & auVar118 | ~auVar118 & auVar75;
                auVar131._0_4_ = -(uint)(iVar29 < iVar15);
                auVar131._4_4_ = -(uint)(iVar29 < iVar15);
                auVar131._8_4_ = -(uint)(iVar29 < iVar15);
                auVar131._12_4_ = -(uint)(iVar29 < iVar15);
                auVar119 = auVar105 & auVar131 | ~auVar131 & auVar125;
                auVar132 = ~auVar131 & auVar105 | auVar125 & auVar131;
                auVar106._8_4_ = -(uint)(auVar93._8_4_ < auVar132._8_4_);
                auVar106._4_4_ = auVar106._8_4_;
                auVar106._0_4_ = auVar106._8_4_;
                auVar106._12_4_ = auVar106._8_4_;
                auVar126 = auVar93 & auVar106 | ~auVar106 & auVar132;
                auVar96._8_4_ = -(uint)(auVar74._8_4_ < auVar119._8_4_);
                auVar96._0_8_ = CONCAT44(auVar96._8_4_,auVar96._8_4_);
                auVar96._12_4_ = auVar96._8_4_;
                pauVar30 = (undefined1 (*) [16])
                           (auVar74._0_8_ & auVar96._0_8_ | ~auVar96._0_8_ & auVar119._0_8_);
                auVar74 = ~auVar96 & auVar74 | auVar119 & auVar96;
                auVar77._8_4_ = -(uint)(auVar74._8_4_ < auVar126._8_4_);
                auVar77._4_4_ = auVar77._8_4_;
                auVar77._0_4_ = auVar77._8_4_;
                auVar77._12_4_ = auVar77._8_4_;
                *pauVar42 = ~auVar106 & auVar93 | auVar132 & auVar106;
                pauVar42[1] = ~auVar77 & auVar74 | auVar126 & auVar77;
                pauVar42[2] = auVar74 & auVar77 | ~auVar77 & auVar126;
                pauVar42 = pauVar42 + 3;
                pauVar43 = pauVar30;
                fVar155 = local_1178;
                fVar147 = fStack_1174;
                fVar148 = fStack_1170;
                fVar149 = fStack_116c;
                fVar141 = local_1188;
                fVar150 = fStack_1184;
                fVar151 = fStack_1180;
                fVar160 = fStack_117c;
              }
            }
          }
        }
        local_11a0 = (ulong)((uint)pauVar43 & 0xf) - 8;
        for (local_1198 = 0; local_1198 != local_11a0; local_1198 = local_1198 + 1) {
          puVar1 = (uint *)(((ulong)pauVar43 & 0xfffffffffffffff0) + local_1198 * 0x60);
          auVar39 = (undefined1  [8])(puVar1 + 0x10);
          local_1190 = context->scene;
          ppfVar17 = (context->scene->vertices).items;
          pfVar18 = ppfVar17[*(uint *)auVar39];
          pfVar13 = pfVar18 + *puVar1;
          uVar28 = *(undefined8 *)(pfVar18 + puVar1[4]);
          pfVar2 = pfVar18 + puVar1[8];
          pfVar3 = pfVar18 + puVar1[0xc];
          pfVar19 = ppfVar17[puVar1[0x11]];
          pfVar4 = pfVar19 + puVar1[1];
          pfVar5 = pfVar19 + puVar1[5];
          pfVar6 = pfVar19 + puVar1[9];
          pfVar19 = pfVar19 + puVar1[0xd];
          pfVar20 = ppfVar17[puVar1[0x12]];
          pfVar7 = pfVar20 + puVar1[2];
          pfVar8 = pfVar20 + puVar1[10];
          pfVar9 = pfVar20 + puVar1[0xe];
          pfVar34 = ppfVar17[puVar1[0x13]];
          pfVar10 = pfVar34 + puVar1[3];
          pfVar11 = pfVar34 + puVar1[0xb];
          pfVar12 = pfVar34 + puVar1[0xf];
          local_1318._0_4_ = (float)uVar28;
          local_1158 = (float)local_1318;
          local_1318._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_1310 = (float)*(undefined8 *)(pfVar18 + puVar1[4] + 2);
          local_1148 = fStack_1310;
          local_12d8 = CONCAT44(*pfVar5,(float)local_1318);
          local_1378 = CONCAT44(pfVar6[2],pfVar2[2]);
          local_1368 = pfVar8[2];
          local_1364 = pfVar11[2];
          local_11b8 = CONCAT44(*pfVar6,*pfVar2);
          fStack_11a8 = *pfVar8;
          fStack_11a4 = *pfVar11;
          local_11c8 = pfVar2[1];
          fStack_11c4 = pfVar6[1];
          fStack_11c0 = pfVar8[1];
          fStack_11bc = pfVar11[1];
          local_1338 = (ray->super_RayK<1>).org.field_0.m128[0];
          local_12f8 = (ray->super_RayK<1>).org.field_0.m128[1];
          fVar138 = (ray->super_RayK<1>).org.field_0.m128[2];
          local_f88 = pfVar13[1] - local_12f8;
          fStack_f84 = pfVar4[1] - local_12f8;
          fStack_f80 = pfVar7[1] - local_12f8;
          fStack_f7c = pfVar10[1] - local_12f8;
          fVar57 = pfVar13[2] - fVar138;
          fVar72 = pfVar4[2] - fVar138;
          fVar152 = pfVar7[2] - fVar138;
          fVar155 = pfVar10[2] - fVar138;
          local_1008 = pfVar3[1];
          fStack_1004 = pfVar19[1];
          fStack_1000 = pfVar9[1];
          fStack_ffc = pfVar12[1];
          local_1328 = pfVar3[1] - local_12f8;
          fStack_1324 = pfVar19[1] - local_12f8;
          fStack_1320 = pfVar9[1] - local_12f8;
          fStack_131c = pfVar12[1] - local_12f8;
          local_fe8 = pfVar3[2];
          fStack_fe4 = pfVar19[2];
          fStack_fe0 = pfVar9[2];
          fStack_fdc = pfVar12[2];
          local_12e8._0_4_ = pfVar3[2] - fVar138;
          local_12e8._4_4_ = pfVar19[2] - fVar138;
          fStack_12e0 = pfVar9[2] - fVar138;
          fStack_12dc = pfVar12[2] - fVar138;
          local_fa8 = local_1328 - local_f88;
          fStack_fa4 = fStack_1324 - fStack_f84;
          fStack_fa0 = fStack_1320 - fStack_f80;
          fStack_f9c = fStack_131c - fStack_f7c;
          local_f98 = (float)local_12e8._0_4_ - fVar57;
          fStack_f94 = (float)local_12e8._4_4_ - fVar72;
          fStack_f90 = fStack_12e0 - fVar152;
          fStack_f8c = fStack_12dc - fVar155;
          fStack_1334 = local_1338;
          fStack_1330 = local_1338;
          fStack_132c = local_1338;
          local_12c8 = *pfVar13 - local_1338;
          fStack_12c4 = *pfVar4 - local_1338;
          fStack_12c0 = *pfVar7 - local_1338;
          fStack_12bc = *pfVar10 - local_1338;
          local_1018 = *pfVar3;
          fStack_1014 = *pfVar19;
          fStack_1010 = *pfVar9;
          fStack_100c = *pfVar12;
          local_1308 = *pfVar3 - local_1338;
          fStack_1304 = *pfVar19 - local_1338;
          fStack_1300 = *pfVar9 - local_1338;
          fStack_12fc = *pfVar12 - local_1338;
          local_fb8 = local_1308 - local_12c8;
          fStack_fb4 = fStack_1304 - fStack_12c4;
          fStack_fb0 = fStack_1300 - fStack_12c0;
          fStack_fac = fStack_12fc - fStack_12bc;
          local_1418._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar140 = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_13e8._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_1418._4_4_ = (float)local_1418;
          fStack_1410 = (float)local_1418;
          fStack_140c = (float)local_1418;
          local_1038 = (local_fa8 * ((float)local_12e8._0_4_ + fVar57) -
                       local_f98 * (local_1328 + local_f88)) * (float)local_1418 +
                       (local_f98 * (local_1308 + local_12c8) -
                       ((float)local_12e8._0_4_ + fVar57) * local_fb8) * fVar140 +
                       ((local_1328 + local_f88) * local_fb8 - (local_1308 + local_12c8) * local_fa8
                       ) * (float)local_13e8._4_4_;
          fStack_1034 = (fStack_fa4 * ((float)local_12e8._4_4_ + fVar72) -
                        fStack_f94 * (fStack_1324 + fStack_f84)) * (float)local_1418 +
                        (fStack_f94 * (fStack_1304 + fStack_12c4) -
                        ((float)local_12e8._4_4_ + fVar72) * fStack_fb4) * fVar140 +
                        ((fStack_1324 + fStack_f84) * fStack_fb4 -
                        (fStack_1304 + fStack_12c4) * fStack_fa4) * (float)local_13e8._4_4_;
          fStack_1030 = (fStack_fa0 * (fStack_12e0 + fVar152) -
                        fStack_f90 * (fStack_1320 + fStack_f80)) * (float)local_1418 +
                        (fStack_f90 * (fStack_1300 + fStack_12c0) -
                        (fStack_12e0 + fVar152) * fStack_fb0) * fVar140 +
                        ((fStack_1320 + fStack_f80) * fStack_fb0 -
                        (fStack_1300 + fStack_12c0) * fStack_fa0) * (float)local_13e8._4_4_;
          fStack_102c = (fStack_f9c * (fStack_12dc + fVar155) -
                        fStack_f8c * (fStack_131c + fStack_f7c)) * (float)local_1418 +
                        (fStack_f8c * (fStack_12fc + fStack_12bc) -
                        (fStack_12dc + fVar155) * fStack_fac) * fVar140 +
                        ((fStack_131c + fStack_f7c) * fStack_fac -
                        (fStack_12fc + fStack_12bc) * fStack_f9c) * (float)local_13e8._4_4_;
          local_ff8 = local_1318._4_4_;
          fStack_ff4 = pfVar5[1];
          fStack_ff0 = pfVar20[(ulong)puVar1[6] + 1];
          fStack_fec = pfVar34[(ulong)puVar1[7] + 1];
          fStack_12f4 = local_12f8;
          fStack_12f0 = local_12f8;
          fStack_12ec = local_12f8;
          local_1138 = local_1318._4_4_ - local_12f8;
          fStack_1134 = pfVar5[1] - local_12f8;
          fStack_1130 = pfVar20[(ulong)puVar1[6] + 1] - local_12f8;
          fStack_112c = pfVar34[(ulong)puVar1[7] + 1] - local_12f8;
          local_1318 = CONCAT44(pfVar5[2],fStack_1310);
          _fStack_1310 = CONCAT44(pfVar34[(ulong)puVar1[7] + 2],pfVar20[(ulong)puVar1[6] + 2]);
          local_1168 = fVar138;
          fStack_1164 = fVar138;
          fStack_1160 = fVar138;
          fStack_115c = fVar138;
          local_1148 = local_1148 - fVar138;
          fStack_1144 = pfVar5[2] - fVar138;
          fStack_1140 = pfVar20[(ulong)puVar1[6] + 2] - fVar138;
          fStack_113c = pfVar34[(ulong)puVar1[7] + 2] - fVar138;
          fVar148 = local_f88 - local_1138;
          fVar149 = fStack_f84 - fStack_1134;
          fVar150 = fStack_f80 - fStack_1130;
          fVar151 = fStack_f7c - fStack_112c;
          local_fd8 = fVar57 - local_1148;
          fStack_fd4 = fVar72 - fStack_1144;
          fStack_fd0 = fVar152 - fStack_1140;
          fStack_fcc = fVar155 - fStack_113c;
          local_1158 = local_1158 - local_1338;
          fStack_1154 = *pfVar5 - local_1338;
          fStack_1150 = fStack_12d0 - local_1338;
          fStack_114c = fStack_12cc - local_1338;
          fVar142 = local_12c8 - local_1158;
          fVar144 = fStack_12c4 - fStack_1154;
          fVar146 = fStack_12c0 - fStack_1150;
          fVar147 = fStack_12bc - fStack_114c;
          local_1028._0_4_ =
               (fVar148 * (fVar57 + local_1148) - local_fd8 * (local_f88 + local_1138)) *
               (float)local_1418 +
               (local_fd8 * (local_12c8 + local_1158) - (fVar57 + local_1148) * fVar142) * fVar140 +
               ((local_f88 + local_1138) * fVar142 - (local_12c8 + local_1158) * fVar148) *
               (float)local_13e8._4_4_;
          local_1028._4_4_ =
               (fVar149 * (fVar72 + fStack_1144) - fStack_fd4 * (fStack_f84 + fStack_1134)) *
               (float)local_1418 +
               (fStack_fd4 * (fStack_12c4 + fStack_1154) - (fVar72 + fStack_1144) * fVar144) *
               fVar140 + ((fStack_f84 + fStack_1134) * fVar144 -
                         (fStack_12c4 + fStack_1154) * fVar149) * (float)local_13e8._4_4_;
          local_1028._8_4_ =
               (fVar150 * (fVar152 + fStack_1140) - fStack_fd0 * (fStack_f80 + fStack_1130)) *
               (float)local_1418 +
               (fStack_fd0 * (fStack_12c0 + fStack_1150) - (fVar152 + fStack_1140) * fVar146) *
               fVar140 + ((fStack_f80 + fStack_1130) * fVar146 -
                         (fStack_12c0 + fStack_1150) * fVar150) * (float)local_13e8._4_4_;
          local_1028._12_4_ =
               (fVar151 * (fVar155 + fStack_113c) - fStack_fcc * (fStack_f7c + fStack_112c)) *
               (float)local_1418 +
               (fStack_fcc * (fStack_12bc + fStack_114c) - (fVar155 + fStack_113c) * fVar147) *
               fVar140 + ((fStack_f7c + fStack_112c) * fVar147 -
                         (fStack_12bc + fStack_114c) * fVar151) * (float)local_13e8._4_4_;
          local_fc8 = local_1138 - local_1328;
          fStack_fc4 = fStack_1134 - fStack_1324;
          fStack_fc0 = fStack_1130 - fStack_1320;
          fStack_fbc = fStack_112c - fStack_131c;
          fVar102 = local_1148 - (float)local_12e8._0_4_;
          fVar112 = fStack_1144 - (float)local_12e8._4_4_;
          fVar113 = fStack_1140 - fStack_12e0;
          fVar114 = fStack_113c - fStack_12dc;
          local_1128 = local_1138 + local_1328;
          fStack_1124 = fStack_1134 + fStack_1324;
          fStack_1120 = fStack_1130 + fStack_1320;
          fStack_111c = fStack_112c + fStack_131c;
          local_1108 = local_1148 + (float)local_12e8._0_4_;
          fStack_1104 = fStack_1144 + (float)local_12e8._4_4_;
          fStack_1100 = fStack_1140 + fStack_12e0;
          fStack_10fc = fStack_113c + fStack_12dc;
          fVar124 = local_1158 - local_1308;
          fVar128 = fStack_1154 - fStack_1304;
          fVar129 = fStack_1150 - fStack_1300;
          fVar130 = fStack_114c - fStack_12fc;
          local_1118 = local_1158 + local_1308;
          fStack_1114 = fStack_1154 + fStack_1304;
          fStack_1110 = fStack_1150 + fStack_1300;
          fStack_110c = fStack_114c + fStack_12fc;
          local_13e8._0_4_ = local_13e8._4_4_;
          fStack_13e0 = (float)local_13e8._4_4_;
          fStack_13dc = (float)local_13e8._4_4_;
          local_1408 = fVar140;
          fStack_1404 = fVar140;
          fStack_1400 = fVar140;
          fStack_13fc = fVar140;
          auVar78._0_4_ =
               (local_fc8 * local_1108 - fVar102 * local_1128) * (float)local_1418 +
               (fVar102 * local_1118 - fVar124 * local_1108) * fVar140 +
               (fVar124 * local_1128 - local_fc8 * local_1118) * (float)local_13e8._4_4_;
          auVar78._4_4_ =
               (fStack_fc4 * fStack_1104 - fVar112 * fStack_1124) * (float)local_1418 +
               (fVar112 * fStack_1114 - fVar128 * fStack_1104) * fVar140 +
               (fVar128 * fStack_1124 - fStack_fc4 * fStack_1114) * (float)local_13e8._4_4_;
          auVar78._8_4_ =
               (fStack_fc0 * fStack_1100 - fVar113 * fStack_1120) * (float)local_1418 +
               (fVar113 * fStack_1110 - fVar129 * fStack_1100) * fVar140 +
               (fVar129 * fStack_1120 - fStack_fc0 * fStack_1110) * (float)local_13e8._4_4_;
          auVar78._12_4_ =
               (fStack_fbc * fStack_10fc - fVar114 * fStack_111c) * (float)local_1418 +
               (fVar114 * fStack_110c - fVar130 * fStack_10fc) * fVar140 +
               (fVar130 * fStack_111c - fStack_fbc * fStack_110c) * (float)local_13e8._4_4_;
          fVar58 = local_1038 + local_1028._0_4_ + auVar78._0_4_;
          fVar73 = fStack_1034 + local_1028._4_4_ + auVar78._4_4_;
          fVar143 = fStack_1030 + local_1028._8_4_ + auVar78._8_4_;
          fVar141 = fStack_102c + local_1028._12_4_ + auVar78._12_4_;
          auVar120._4_4_ = fStack_1034;
          auVar120._0_4_ = local_1038;
          auVar120._8_4_ = fStack_1030;
          auVar120._12_4_ = fStack_102c;
          auVar115 = minps(auVar120,local_1028);
          auVar115 = minps(auVar115,auVar78);
          auVar135._4_4_ = fStack_1034;
          auVar135._0_4_ = local_1038;
          auVar135._8_4_ = fStack_1030;
          auVar135._12_4_ = fStack_102c;
          auVar74 = maxps(auVar135,local_1028);
          auVar74 = maxps(auVar74,auVar78);
          fVar145 = ABS(fVar58) * 1.1920929e-07;
          fVar157 = ABS(fVar73) * 1.1920929e-07;
          fVar90 = ABS(fVar143) * 1.1920929e-07;
          fVar91 = ABS(fVar141) * 1.1920929e-07;
          auVar136._4_4_ = -(uint)(auVar74._4_4_ <= fVar157);
          auVar136._0_4_ = -(uint)(auVar74._0_4_ <= fVar145);
          auVar136._8_4_ = -(uint)(auVar74._8_4_ <= fVar90);
          auVar136._12_4_ = -(uint)(auVar74._12_4_ <= fVar91);
          auVar121._4_4_ = -(uint)(-fVar157 <= auVar115._4_4_);
          auVar121._0_4_ = -(uint)(-fVar145 <= auVar115._0_4_);
          auVar121._8_4_ = -(uint)(-fVar90 <= auVar115._8_4_);
          auVar121._12_4_ = -(uint)(-fVar91 <= auVar115._12_4_);
          auVar136 = auVar136 | auVar121;
          local_13b8 = local_1198 * 0x60 + ((ulong)pauVar43 & 0xfffffffffffffff0);
          iVar29 = movmskps((int)local_13b8,auVar136);
          if (iVar29 == 0) {
            uVar45 = 0;
          }
          else {
            local_1048 = fVar58;
            fStack_1044 = fVar73;
            fStack_1040 = fVar143;
            fStack_103c = fVar141;
            uVar45 = -(uint)(ABS(local_fd8 * local_fc8) <= ABS(local_f98 * fVar148));
            uVar47 = -(uint)(ABS(fStack_fd4 * fStack_fc4) <= ABS(fStack_f94 * fVar149));
            uVar51 = -(uint)(ABS(fStack_fd0 * fStack_fc0) <= ABS(fStack_f90 * fVar150));
            uVar54 = -(uint)(ABS(fStack_fcc * fStack_fbc) <= ABS(fStack_f8c * fVar151));
            uVar46 = -(uint)(ABS(fVar142 * fVar102) <= ABS(local_fb8 * local_fd8));
            uVar48 = -(uint)(ABS(fVar144 * fVar112) <= ABS(fStack_fb4 * fStack_fd4));
            uVar52 = -(uint)(ABS(fVar146 * fVar113) <= ABS(fStack_fb0 * fStack_fd0));
            uVar55 = -(uint)(ABS(fVar147 * fVar114) <= ABS(fStack_fac * fStack_fcc));
            uVar50 = -(uint)(ABS(fVar148 * fVar124) <= ABS(local_fa8 * fVar142));
            uVar49 = -(uint)(ABS(fVar149 * fVar128) <= ABS(fStack_fa4 * fVar144));
            uVar53 = -(uint)(ABS(fVar150 * fVar129) <= ABS(fStack_fa0 * fVar146));
            uVar56 = -(uint)(ABS(fVar151 * fVar130) <= ABS(fStack_f9c * fVar147));
            local_1288._0_4_ =
                 ~uVar45 & (uint)(local_fa8 * local_fd8 - local_f98 * fVar148) |
                 (uint)(fVar148 * fVar102 - local_fd8 * local_fc8) & uVar45;
            local_1288._4_4_ =
                 ~uVar47 & (uint)(fStack_fa4 * fStack_fd4 - fStack_f94 * fVar149) |
                 (uint)(fVar149 * fVar112 - fStack_fd4 * fStack_fc4) & uVar47;
            fStack_1280 = (float)(~uVar51 & (uint)(fStack_fa0 * fStack_fd0 - fStack_f90 * fVar150) |
                                 (uint)(fVar150 * fVar113 - fStack_fd0 * fStack_fc0) & uVar51);
            fStack_127c = (float)(~uVar54 & (uint)(fStack_f9c * fStack_fcc - fStack_f8c * fVar151) |
                                 (uint)(fVar151 * fVar114 - fStack_fcc * fStack_fbc) & uVar54);
            local_1278 = (float)(~uVar46 & (uint)(local_f98 * fVar142 - local_fb8 * local_fd8) |
                                (uint)(local_fd8 * fVar124 - fVar142 * fVar102) & uVar46);
            fStack_1274 = (float)(~uVar48 & (uint)(fStack_f94 * fVar144 - fStack_fb4 * fStack_fd4) |
                                 (uint)(fStack_fd4 * fVar128 - fVar144 * fVar112) & uVar48);
            fStack_1270 = (float)(~uVar52 & (uint)(fStack_f90 * fVar146 - fStack_fb0 * fStack_fd0) |
                                 (uint)(fStack_fd0 * fVar129 - fVar146 * fVar113) & uVar52);
            fStack_126c = (float)(~uVar55 & (uint)(fStack_f8c * fVar147 - fStack_fac * fStack_fcc) |
                                 (uint)(fStack_fcc * fVar130 - fVar147 * fVar114) & uVar55);
            local_1268._0_4_ =
                 ~uVar50 & (uint)(local_fb8 * fVar148 - local_fa8 * fVar142) |
                 (uint)(fVar142 * local_fc8 - fVar148 * fVar124) & uVar50;
            local_1268._4_4_ =
                 ~uVar49 & (uint)(fStack_fb4 * fVar149 - fStack_fa4 * fVar144) |
                 (uint)(fVar144 * fStack_fc4 - fVar149 * fVar128) & uVar49;
            fStack_1260 = (float)(~uVar53 & (uint)(fStack_fb0 * fVar150 - fStack_fa0 * fVar146) |
                                 (uint)(fVar146 * fStack_fc0 - fVar150 * fVar129) & uVar53);
            fStack_125c = (float)(~uVar56 & (uint)(fStack_fac * fVar151 - fStack_f9c * fVar147) |
                                 (uint)(fVar147 * fStack_fbc - fVar151 * fVar130) & uVar56);
            fVar145 = (float)local_1418 * (float)local_1288._0_4_ +
                      fVar140 * local_1278 + (float)local_13e8._4_4_ * (float)local_1268._0_4_;
            fVar157 = (float)local_1418 * (float)local_1288._4_4_ +
                      fVar140 * fStack_1274 + (float)local_13e8._4_4_ * (float)local_1268._4_4_;
            fVar90 = (float)local_1418 * fStack_1280 +
                     fVar140 * fStack_1270 + (float)local_13e8._4_4_ * fStack_1260;
            fVar91 = (float)local_1418 * fStack_127c +
                     fVar140 * fStack_126c + (float)local_13e8._4_4_ * fStack_125c;
            auVar79._0_4_ = fVar145 + fVar145;
            auVar79._4_4_ = fVar157 + fVar157;
            auVar79._8_4_ = fVar90 + fVar90;
            auVar79._12_4_ = fVar91 + fVar91;
            auVar59._0_4_ = fVar57 * (float)local_1268._0_4_;
            auVar59._4_4_ = fVar72 * (float)local_1268._4_4_;
            auVar59._8_4_ = fVar152 * fStack_1260;
            auVar59._12_4_ = fVar155 * fStack_125c;
            fVar145 = local_12c8 * (float)local_1288._0_4_ + local_f88 * local_1278 + auVar59._0_4_;
            fVar157 = fStack_12c4 * (float)local_1288._4_4_ +
                      fStack_f84 * fStack_1274 + auVar59._4_4_;
            fVar90 = fStack_12c0 * fStack_1280 + fStack_f80 * fStack_1270 + auVar59._8_4_;
            fVar91 = fStack_12bc * fStack_127c + fStack_f7c * fStack_126c + auVar59._12_4_;
            auVar115 = rcpps(auVar59,auVar79);
            fVar57 = auVar115._0_4_;
            fVar72 = auVar115._4_4_;
            fVar152 = auVar115._8_4_;
            fVar155 = auVar115._12_4_;
            fVar145 = ((1.0 - auVar79._0_4_ * fVar57) * fVar57 + fVar57) * (fVar145 + fVar145);
            fVar72 = ((1.0 - auVar79._4_4_ * fVar72) * fVar72 + fVar72) * (fVar157 + fVar157);
            fVar152 = ((1.0 - auVar79._8_4_ * fVar152) * fVar152 + fVar152) * (fVar90 + fVar90);
            fVar155 = ((1.0 - auVar79._12_4_ * fVar155) * fVar155 + fVar155) * (fVar91 + fVar91);
            local_1408 = (ray->super_RayK<1>).tfar;
            fStack_1404 = (float)(ray->super_RayK<1>).mask;
            fStack_1400 = (float)(ray->super_RayK<1>).id;
            fStack_13fc = (float)(ray->super_RayK<1>).flags;
            fVar57 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar60._4_4_ = -(uint)(fVar57 <= fVar72);
            auVar60._0_4_ = -(uint)(fVar57 <= fVar145);
            auVar60._8_4_ = -(uint)(fVar57 <= fVar152);
            auVar60._12_4_ = -(uint)(fVar57 <= fVar155);
            auVar80._0_4_ =
                 -(uint)(auVar79._0_4_ != 0.0) & auVar136._0_4_ &
                 -(uint)(fVar145 <= local_1408 && fVar57 <= fVar145);
            auVar80._4_4_ =
                 -(uint)(auVar79._4_4_ != 0.0) & auVar136._4_4_ &
                 -(uint)(fVar72 <= local_1408 && fVar57 <= fVar72);
            auVar80._8_4_ =
                 -(uint)(auVar79._8_4_ != 0.0) & auVar136._8_4_ &
                 -(uint)(fVar152 <= local_1408 && fVar57 <= fVar152);
            auVar80._12_4_ =
                 -(uint)(auVar79._12_4_ != 0.0) & auVar136._12_4_ &
                 -(uint)(fVar155 <= local_1408 && fVar57 <= fVar155);
            uVar45 = movmskps(iVar29,auVar80);
            if (uVar45 != 0) {
              local_12b8._4_4_ = fStack_1034;
              local_12b8._0_4_ = local_1038;
              fStack_12b0 = fStack_1030;
              fStack_12ac = fStack_102c;
              local_12a8 = local_1028._0_4_;
              fStack_12a4 = local_1028._4_4_;
              fStack_12a0 = local_1028._8_4_;
              fStack_129c = local_1028._12_4_;
              local_1298._4_4_ = fVar73;
              local_1298._0_4_ = fVar58;
              local_1298._8_4_ = fVar143;
              local_1298._12_4_ = fVar141;
              local_1258 = auVar80;
              local_1228[0] = fVar145;
              local_1228[1] = fVar72;
              local_1228[2] = fVar152;
              local_1228[3] = fVar155;
              local_11e8 = local_10c8._0_4_;
              uStack_11e4 = local_10c8._4_4_;
              uStack_11e0 = local_10c8._8_4_;
              uStack_11dc = local_10c8._12_4_;
              local_13f8 = auVar80;
              auVar115 = rcpps(auVar60,local_1298);
              fVar138 = auVar115._0_4_;
              fVar140 = auVar115._4_4_;
              fVar57 = auVar115._8_4_;
              fVar157 = auVar115._12_4_;
              fVar102 = DAT_01f46a60._4_4_;
              fVar112 = DAT_01f46a60._12_4_;
              fVar90 = (float)DAT_01f46a60;
              fVar91 = DAT_01f46a60._8_4_;
              fVar138 = (float)(-(uint)(1e-18 <= ABS(fVar58)) &
                               (uint)((fVar90 - fVar58 * fVar138) * fVar138 + fVar138));
              fVar140 = (float)(-(uint)(1e-18 <= ABS(fVar73)) &
                               (uint)((fVar102 - fVar73 * fVar140) * fVar140 + fVar140));
              fVar57 = (float)(-(uint)(1e-18 <= ABS(fVar143)) &
                              (uint)((fVar91 - fVar143 * fVar57) * fVar57 + fVar57));
              fVar58 = (float)(-(uint)(1e-18 <= ABS(fVar141)) &
                              (uint)((fVar112 - fVar141 * fVar157) * fVar157 + fVar157));
              auVar153._0_4_ = local_1038 * fVar138;
              auVar153._4_4_ = fStack_1034 * fVar140;
              auVar153._8_4_ = fStack_1030 * fVar57;
              auVar153._12_4_ = fStack_102c * fVar58;
              auVar74 = minps(auVar153,_DAT_01f46a60);
              auVar139._0_4_ = fVar138 * local_1028._0_4_;
              auVar139._4_4_ = fVar140 * local_1028._4_4_;
              auVar139._8_4_ = fVar57 * local_1028._8_4_;
              auVar139._12_4_ = fVar58 * local_1028._12_4_;
              auVar115 = minps(auVar139,_DAT_01f46a60);
              local_1248 = (float)((uint)auVar74._0_4_ & local_10f8._0_4_ |
                                  (uint)(fVar90 - auVar74._0_4_) & local_10c8._0_4_);
              uStack_1244 = (uint)auVar74._4_4_ & local_10f8._4_4_ |
                            (uint)(fVar102 - auVar74._4_4_) & local_10c8._4_4_;
              uStack_1240 = (uint)auVar74._8_4_ & local_10f8._8_4_ |
                            (uint)(fVar91 - auVar74._8_4_) & local_10c8._8_4_;
              uStack_123c = (uint)auVar74._12_4_ & local_10f8._12_4_ |
                            (uint)(fVar112 - auVar74._12_4_) & local_10c8._12_4_;
              local_1238._4_4_ =
                   (uint)auVar115._4_4_ & local_10f8._4_4_ |
                   (uint)(fVar102 - auVar115._4_4_) & local_10c8._4_4_;
              local_1238._0_4_ =
                   (uint)auVar115._0_4_ & local_10f8._0_4_ |
                   (uint)(fVar90 - auVar115._0_4_) & local_10c8._0_4_;
              local_1238._8_4_ =
                   (uint)auVar115._8_4_ & local_10f8._8_4_ |
                   (uint)(fVar91 - auVar115._8_4_) & local_10c8._8_4_;
              local_1238._12_4_ =
                   (uint)auVar115._12_4_ & local_10f8._12_4_ |
                   (uint)(fVar112 - auVar115._12_4_) & local_10c8._12_4_;
              local_1218._4_4_ = local_1288._4_4_;
              local_1218._0_4_ = local_1288._0_4_;
              fStack_1210 = fStack_1280;
              fStack_120c = fStack_127c;
              local_1208[0] = local_1278;
              local_1208[1] = fStack_1274;
              local_1208[2] = fStack_1270;
              local_1208[3] = fStack_126c;
              local_11f8._4_4_ = local_1268._4_4_;
              local_11f8._0_4_ = local_1268._0_4_;
              fStack_11f0 = fStack_1260;
              fStack_11ec = fStack_125c;
              auVar61._0_4_ = (uint)fVar145 & auVar80._0_4_;
              auVar61._4_4_ = (uint)fVar72 & auVar80._4_4_;
              auVar61._8_4_ = (uint)fVar152 & auVar80._8_4_;
              auVar61._12_4_ = (uint)fVar155 & auVar80._12_4_;
              auVar97._0_8_ = CONCAT44(~auVar80._4_4_,~auVar80._0_4_) & 0x7f8000007f800000;
              auVar97._8_4_ = ~auVar80._8_4_ & 0x7f800000;
              auVar97._12_4_ = ~auVar80._12_4_ & 0x7f800000;
              auVar97 = auVar97 | auVar61;
              auVar107._4_4_ = auVar97._0_4_;
              auVar107._0_4_ = auVar97._4_4_;
              auVar107._8_4_ = auVar97._12_4_;
              auVar107._12_4_ = auVar97._8_4_;
              auVar115 = minps(auVar107,auVar97);
              auVar62._0_8_ = auVar115._8_8_;
              auVar62._8_4_ = auVar115._0_4_;
              auVar62._12_4_ = auVar115._4_4_;
              auVar115 = minps(auVar62,auVar115);
              auVar63._0_8_ =
                   CONCAT44(-(uint)(auVar115._4_4_ == auVar97._4_4_) & auVar80._4_4_,
                            -(uint)(auVar115._0_4_ == auVar97._0_4_) & auVar80._0_4_);
              auVar63._8_4_ = -(uint)(auVar115._8_4_ == auVar97._8_4_) & auVar80._8_4_;
              auVar63._12_4_ = -(uint)(auVar115._12_4_ == auVar97._12_4_) & auVar80._12_4_;
              iVar29 = movmskps(uVar45,auVar63);
              if (iVar29 != 0) {
                auVar80._8_4_ = auVar63._8_4_;
                auVar80._0_8_ = auVar63._0_8_;
                auVar80._12_4_ = auVar63._12_4_;
              }
              uVar31 = movmskps((int)pfVar34,auVar80);
              uVar36 = CONCAT44((int)((ulong)pfVar34 >> 0x20),uVar31);
              lVar37 = 0;
              uVar45 = (uint)fStack_1404;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
LAB_005837b5:
              local_1350 = *(uint *)((long)auVar39 + lVar37 * 4);
              pRVar33 = (RTCIntersectArguments *)(ulong)local_1350;
              pGVar21 = (local_1190->geometries).items[(long)pRVar33].ptr;
              if ((pGVar21->mask & uVar45) == 0) {
                *(undefined4 *)(local_13f8 + lVar37 * 4) = 0;
                goto LAB_00583801;
              }
              local_1418 = (Scene *)context->args;
              if (((RTCIntersectArguments *)local_1418)->filter == (RTCFilterFunctionN)0x0) {
                local_13a8.context = context->user;
                if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                  fVar138 = (&local_1248)[lVar37];
                  fVar140 = local_1228[lVar37 + -4];
                  (ray->super_RayK<1>).tfar = local_1228[lVar37];
                  (ray->Ng).field_0.field_0.x = local_1208[lVar37 + -4];
                  (ray->Ng).field_0.field_0.y = local_1208[lVar37];
                  (ray->Ng).field_0.field_0.z = *(float *)(local_11f8 + lVar37 * 4);
                  ray->u = fVar138;
                  ray->v = fVar140;
                  ray->primID = *(uint *)(local_13b8 + 0x50 + lVar37 * 4);
                  ray->geomID = local_1350;
                  pfVar34 = (float *)(ulong)(local_13a8.context)->instID[0];
                  ray->instID[0] = (local_13a8.context)->instID[0];
                  uVar45 = (local_13a8.context)->instPrimID[0];
                  ray->instPrimID[0] = uVar45;
LAB_00583b11:
                  local_1338 = (ray->super_RayK<1>).org.field_0.m128[0];
                  local_12f8 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar138 = (ray->super_RayK<1>).org.field_0.m128[2];
                  local_1418._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
                  fVar140 = (ray->super_RayK<1>).dir.field_0.m128[1];
                  local_13e8._4_4_ = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
                  local_1418._4_4_ = (float)local_1418;
                  fStack_1410 = (float)local_1418;
                  fStack_140c = (float)local_1418;
                  local_13e8._0_4_ = local_13e8._4_4_;
                  fStack_13e0 = (float)local_13e8._4_4_;
                  fStack_13dc = (float)local_13e8._4_4_;
                  local_1328 = local_1008 - local_12f8;
                  fStack_1324 = fStack_1004 - local_12f8;
                  fStack_1320 = fStack_1000 - local_12f8;
                  fStack_131c = fStack_ffc - local_12f8;
                  fStack_12f4 = local_12f8;
                  fStack_12f0 = local_12f8;
                  fStack_12ec = local_12f8;
                  local_1118 = (local_1018 - local_1338) + ((float)local_12d8 - local_1338);
                  fStack_1114 = (fStack_1014 - local_1338) + (local_12d8._4_4_ - local_1338);
                  fStack_1110 = (fStack_1010 - local_1338) + (fStack_12d0 - local_1338);
                  fStack_110c = (fStack_100c - local_1338) + (fStack_12cc - local_1338);
                  local_1128 = local_1328 + (local_ff8 - local_12f8);
                  fStack_1124 = fStack_1324 + (fStack_ff4 - local_12f8);
                  fStack_1120 = fStack_1320 + (fStack_ff0 - local_12f8);
                  fStack_111c = fStack_131c + (fStack_fec - local_12f8);
                  local_1108 = (local_fe8 - fVar138) + ((float)local_1318 - fVar138);
                  fStack_1104 = (fStack_fe4 - fVar138) + (local_1318._4_4_ - fVar138);
                  fStack_1100 = (fStack_fe0 - fVar138) + (fStack_1310 - fVar138);
                  fStack_10fc = (fStack_fdc - fVar138) + (fStack_130c - fVar138);
                  local_1148 = (float)local_1318 - fVar138;
                  fStack_1144 = local_1318._4_4_ - fVar138;
                  fStack_1140 = fStack_1310 - fVar138;
                  fStack_113c = fStack_130c - fVar138;
                  local_1138 = local_ff8 - local_12f8;
                  fStack_1134 = fStack_ff4 - local_12f8;
                  fStack_1130 = fStack_ff0 - local_12f8;
                  fStack_112c = fStack_fec - local_12f8;
                  local_1158 = (float)local_12d8 - local_1338;
                  fStack_1154 = local_12d8._4_4_ - local_1338;
                  fStack_1150 = fStack_12d0 - local_1338;
                  fStack_114c = fStack_12cc - local_1338;
                  local_12e8._4_4_ = fStack_fe4 - fVar138;
                  local_12e8._0_4_ = local_fe8 - fVar138;
                  fStack_12e0 = fStack_fe0 - fVar138;
                  fStack_12dc = fStack_fdc - fVar138;
                  local_1308 = local_1018 - local_1338;
                  fStack_1304 = fStack_1014 - local_1338;
                  fStack_1300 = fStack_1010 - local_1338;
                  fStack_12fc = fStack_100c - local_1338;
                  uVar36 = local_13b0;
                  goto LAB_00583bf7;
                }
              }
              else {
                local_13a8.context = context->user;
              }
              local_1368 = local_1208[lVar37 + -4];
              local_1364 = local_1208[lVar37];
              local_1360 = *(undefined4 *)(local_11f8 + lVar37 * 4);
              local_135c = (&local_1248)[lVar37];
              local_1358 = local_1228[lVar37 + -4];
              local_1354 = *(undefined4 *)(local_13b8 + 0x50 + lVar37 * 4);
              local_134c = (local_13a8.context)->instID[0];
              local_1348 = (local_13a8.context)->instPrimID[0];
              (ray->super_RayK<1>).tfar = local_1228[lVar37];
              local_141c = -1;
              local_13a8.valid = &local_141c;
              pRVar33 = (RTCIntersectArguments *)pGVar21->userPtr;
              local_13a8.geometryUserPtr = pRVar33;
              local_13a8.ray = (RTCRayN *)ray;
              local_13a8.hit = (RTCHitN *)&local_1368;
              local_13a8.N = 1;
              if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0058399c:
                if ((((RTCIntersectArguments *)local_1418)->filter != (RTCFilterFunctionN)0x0) &&
                   ((((((RTCIntersectArguments *)local_1418)->flags &
                      RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                     (((pGVar21->field_8).field_0x2 & 0x40) != 0)) &&
                    ((*((RTCIntersectArguments *)local_1418)->filter)(&local_13a8),
                    pRVar33 = (RTCIntersectArguments *)local_1418, context = local_13c0,
                    ray = local_13c8, uVar41 = local_13d0, *local_13a8.valid == 0))))
                goto LAB_00583a57;
                (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_13a8.hit;
                (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_13a8.hit + 4);
                (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_13a8.hit + 8);
                *(float *)((long)local_13a8.ray + 0x3c) = *(float *)(local_13a8.hit + 0xc);
                *(float *)((long)local_13a8.ray + 0x40) = *(float *)(local_13a8.hit + 0x10);
                *(float *)((long)local_13a8.ray + 0x44) = *(float *)(local_13a8.hit + 0x14);
                *(float *)((long)local_13a8.ray + 0x48) = *(float *)(local_13a8.hit + 0x18);
                *(float *)((long)local_13a8.ray + 0x4c) = *(float *)(local_13a8.hit + 0x1c);
                pRVar33 = (RTCIntersectArguments *)(ulong)(uint)*(float *)(local_13a8.hit + 0x20);
                *(float *)((long)local_13a8.ray + 0x50) = *(float *)(local_13a8.hit + 0x20);
              }
              else {
                local_13e8 = auVar39;
                (*pGVar21->intersectionFilterN)(&local_13a8);
                auVar39 = local_13e8;
                context = local_13c0;
                ray = local_13c8;
                uVar41 = local_13d0;
                if (*local_13a8.valid != 0) goto LAB_0058399c;
LAB_00583a57:
                (local_13c8->super_RayK<1>).tfar = local_1408;
                context = local_13c0;
                ray = local_13c8;
                uVar41 = local_13d0;
              }
              *(undefined4 *)(local_13f8 + lVar37 * 4) = 0;
              local_1408 = (ray->super_RayK<1>).tfar;
              fStack_1404 = (float)(ray->super_RayK<1>).mask;
              fStack_1400 = (float)(ray->super_RayK<1>).id;
              fStack_13fc = (float)(ray->super_RayK<1>).flags;
              local_13f8._0_4_ = -(uint)(fVar145 <= local_1408) & local_13f8._0_4_;
              local_13f8._4_4_ = -(uint)(fVar72 <= local_1408) & local_13f8._4_4_;
              local_13f8._8_4_ = -(uint)(fVar152 <= local_1408) & local_13f8._8_4_;
              local_13f8._12_4_ = -(uint)(fVar155 <= local_1408) & local_13f8._12_4_;
              uVar45 = (ray->super_RayK<1>).mask;
LAB_00583801:
              uVar31 = (undefined4)((ulong)pRVar33 >> 0x20);
              iVar29 = movmskps((int)pRVar33,local_13f8);
              pfVar34 = (float *)CONCAT44(uVar31,iVar29);
              if (iVar29 == 0) goto LAB_00583b11;
              uVar46 = local_13f8._0_4_;
              uVar50 = local_13f8._4_4_;
              uVar47 = local_13f8._8_4_;
              uVar48 = local_13f8._12_4_;
              auVar81._0_4_ = uVar46 & (uint)fVar145;
              auVar81._4_4_ = uVar50 & (uint)fVar72;
              auVar81._8_4_ = uVar47 & (uint)fVar152;
              auVar81._12_4_ = uVar48 & (uint)fVar155;
              auVar98._0_8_ = CONCAT44(~uVar50,~uVar46) & 0x7f8000007f800000;
              auVar98._8_4_ = ~uVar47 & 0x7f800000;
              auVar98._12_4_ = ~uVar48 & 0x7f800000;
              auVar98 = auVar98 | auVar81;
              auVar108._4_4_ = auVar98._0_4_;
              auVar108._0_4_ = auVar98._4_4_;
              auVar108._8_4_ = auVar98._12_4_;
              auVar108._12_4_ = auVar98._8_4_;
              auVar115 = minps(auVar108,auVar98);
              auVar82._0_8_ = auVar115._8_8_;
              auVar82._8_4_ = auVar115._0_4_;
              auVar82._12_4_ = auVar115._4_4_;
              auVar115 = minps(auVar82,auVar115);
              auVar83._0_8_ =
                   CONCAT44(-(uint)(auVar115._4_4_ == auVar98._4_4_) & uVar50,
                            -(uint)(auVar115._0_4_ == auVar98._0_4_) & uVar46);
              auVar83._8_4_ = -(uint)(auVar115._8_4_ == auVar98._8_4_) & uVar47;
              auVar83._12_4_ = -(uint)(auVar115._12_4_ == auVar98._12_4_) & uVar48;
              iVar29 = movmskps(iVar29,auVar83);
              auVar64 = local_13f8;
              if (iVar29 != 0) {
                auVar64._8_4_ = auVar83._8_4_;
                auVar64._0_8_ = auVar83._0_8_;
                auVar64._12_4_ = auVar83._12_4_;
              }
              uVar32 = movmskps(iVar29,auVar64);
              uVar36 = CONCAT44(uVar31,uVar32);
              lVar37 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              goto LAB_005837b5;
            }
          }
LAB_00583bf7:
          fStack_1410 = local_1418._4_4_;
          local_1408 = fVar140;
          fStack_1404 = fVar140;
          fStack_1400 = fVar140;
          fStack_13fc = fVar140;
          local_1378._0_4_ = (float)local_1378 - fVar138;
          local_1378._4_4_ = local_1378._4_4_ - fVar138;
          fStack_1370 = fStack_1370 - fVar138;
          fStack_136c = fStack_136c - fVar138;
          local_11c8 = local_11c8 - fStack_12ec;
          fStack_11c4 = fStack_11c4 - fStack_12ec;
          fStack_11c0 = fStack_11c0 - fStack_12ec;
          fStack_11bc = fStack_11bc - fStack_12ec;
          local_11b8._0_4_ = (float)local_11b8 - local_1338;
          local_11b8._4_4_ = local_11b8._4_4_ - local_1338;
          fStack_11b0 = fStack_11b0 - local_1338;
          fStack_11ac = fStack_11ac - local_1338;
          fVar161 = local_1158 - (float)local_11b8;
          fVar162 = fStack_1154 - local_11b8._4_4_;
          fVar163 = fStack_1150 - fStack_11b0;
          fVar164 = fStack_114c - fStack_11ac;
          local_12c8 = local_1138 - local_11c8;
          fStack_12c4 = fStack_1134 - fStack_11c4;
          fStack_12c0 = fStack_1130 - fStack_11c0;
          fStack_12bc = fStack_112c - fStack_11bc;
          local_1338 = local_1148 - (float)local_1378;
          fStack_1334 = fStack_1144 - local_1378._4_4_;
          fStack_1330 = fStack_1140 - fStack_1370;
          fStack_132c = fStack_113c - fStack_136c;
          fVar128 = local_1328 - local_1138;
          fVar129 = fStack_1324 - fStack_1134;
          fVar130 = fStack_1320 - fStack_1130;
          fVar142 = fStack_131c - fStack_112c;
          fVar165 = (float)local_12e8._0_4_ - local_1148;
          fVar166 = (float)local_12e8._4_4_ - fStack_1144;
          fStack_12d0 = fStack_12e0 - fStack_1140;
          fStack_12cc = fStack_12dc - fStack_113c;
          fVar138 = local_1308 - local_1158;
          fVar57 = fStack_1304 - fStack_1154;
          fVar58 = fStack_1300 - fStack_1150;
          fVar72 = fStack_12fc - fStack_114c;
          local_1318 = CONCAT44(fVar162,fVar161);
          _fStack_1310 = CONCAT44(fVar164,fVar163);
          fVar73 = local_11c8 - local_1328;
          fVar152 = fStack_11c4 - fStack_1324;
          fVar143 = fStack_11c0 - fStack_1320;
          fVar155 = fStack_11bc - fStack_131c;
          fVar157 = local_13e8._0_4_;
          fVar90 = local_13e8._4_4_;
          fVar91 = local_13e8._8_4_;
          fVar102 = local_13e8._12_4_;
          fVar144 = (float)local_1378 - (float)local_12e8._0_4_;
          fVar146 = local_1378._4_4_ - (float)local_12e8._4_4_;
          fVar147 = fStack_1370 - fStack_12e0;
          fVar148 = fStack_136c - fStack_12dc;
          fVar141 = (local_12c8 * (local_1148 + (float)local_1378) -
                    local_1338 * (local_1138 + local_11c8)) * local_1418._4_4_ +
                    (local_1338 * (local_1158 + (float)local_11b8) -
                    (local_1148 + (float)local_1378) * fVar161) * fVar140 +
                    ((local_1138 + local_11c8) * fVar161 -
                    (local_1158 + (float)local_11b8) * local_12c8) * fVar157;
          fVar145 = (fStack_12c4 * (fStack_1144 + local_1378._4_4_) -
                    fStack_1334 * (fStack_1134 + fStack_11c4)) * local_1418._4_4_ +
                    (fStack_1334 * (fStack_1154 + local_11b8._4_4_) -
                    (fStack_1144 + local_1378._4_4_) * fVar162) * fVar140 +
                    ((fStack_1134 + fStack_11c4) * fVar162 -
                    (fStack_1154 + local_11b8._4_4_) * fStack_12c4) * fVar90;
          auVar122._0_8_ = CONCAT44(fVar145,fVar141);
          auVar122._8_4_ =
               (fStack_12c0 * (fStack_1140 + fStack_1370) -
               fStack_1330 * (fStack_1130 + fStack_11c0)) * local_1418._4_4_ +
               (fStack_1330 * (fStack_1150 + fStack_11b0) - (fStack_1140 + fStack_1370) * fVar163) *
               fVar140 + ((fStack_1130 + fStack_11c0) * fVar163 -
                         (fStack_1150 + fStack_11b0) * fStack_12c0) * fVar91;
          auVar122._12_4_ =
               (fStack_12bc * (fStack_113c + fStack_136c) -
               fStack_132c * (fStack_112c + fStack_11bc)) * local_1418._4_4_ +
               (fStack_132c * (fStack_114c + fStack_11ac) - (fStack_113c + fStack_136c) * fVar164) *
               fVar140 + ((fStack_112c + fStack_11bc) * fVar164 -
                         (fStack_114c + fStack_11ac) * fStack_12bc) * fVar102;
          fVar149 = (float)local_11b8 - local_1308;
          fVar150 = local_11b8._4_4_ - fStack_1304;
          fVar151 = fStack_11b0 - fStack_1300;
          fVar160 = fStack_11ac - fStack_12fc;
          local_12f8 = (fVar73 * ((float)local_12e8._0_4_ + (float)local_1378) -
                       fVar144 * (local_1328 + local_11c8)) * local_1418._4_4_ +
                       (fVar144 * (local_1308 + (float)local_11b8) -
                       ((float)local_12e8._0_4_ + (float)local_1378) * fVar149) * fVar140 +
                       ((local_1328 + local_11c8) * fVar149 -
                       (local_1308 + (float)local_11b8) * fVar73) * fVar157;
          fStack_12f4 = (fVar152 * ((float)local_12e8._4_4_ + local_1378._4_4_) -
                        fVar146 * (fStack_1324 + fStack_11c4)) * local_1418._4_4_ +
                        (fVar146 * (fStack_1304 + local_11b8._4_4_) -
                        ((float)local_12e8._4_4_ + local_1378._4_4_) * fVar150) * fVar140 +
                        ((fStack_1324 + fStack_11c4) * fVar150 -
                        (fStack_1304 + local_11b8._4_4_) * fVar152) * fVar90;
          fStack_12f0 = (fVar143 * (fStack_12e0 + fStack_1370) -
                        fVar147 * (fStack_1320 + fStack_11c0)) * local_1418._4_4_ +
                        (fVar147 * (fStack_1300 + fStack_11b0) -
                        (fStack_12e0 + fStack_1370) * fVar151) * fVar140 +
                        ((fStack_1320 + fStack_11c0) * fVar151 -
                        (fStack_1300 + fStack_11b0) * fVar143) * fVar91;
          fStack_12ec = (fVar155 * (fStack_12dc + fStack_136c) -
                        fVar148 * (fStack_131c + fStack_11bc)) * local_1418._4_4_ +
                        (fVar148 * (fStack_12fc + fStack_11ac) -
                        (fStack_12dc + fStack_136c) * fVar160) * fVar140 +
                        ((fStack_131c + fStack_11bc) * fVar160 -
                        (fStack_12fc + fStack_11ac) * fVar155) * fVar102;
          local_12d8 = CONCAT44(fVar166,fVar165);
          local_1328 = fVar128;
          fStack_1324 = fVar129;
          fStack_1320 = fVar130;
          fStack_131c = fVar142;
          auVar133._0_4_ =
               (fVar128 * local_1108 - fVar165 * local_1128) * local_1418._4_4_ +
               (fVar165 * local_1118 - local_1108 * fVar138) * fVar140 +
               (local_1128 * fVar138 - local_1118 * fVar128) * fVar157;
          auVar133._4_4_ =
               (fVar129 * fStack_1104 - fVar166 * fStack_1124) * local_1418._4_4_ +
               (fVar166 * fStack_1114 - fStack_1104 * fVar57) * fVar140 +
               (fStack_1124 * fVar57 - fStack_1114 * fVar129) * fVar90;
          auVar133._8_4_ =
               (fVar130 * fStack_1100 - fStack_12d0 * fStack_1120) * local_1418._4_4_ +
               (fStack_12d0 * fStack_1110 - fStack_1100 * fVar58) * fVar140 +
               (fStack_1120 * fVar58 - fStack_1110 * fVar130) * fVar91;
          auVar133._12_4_ =
               (fVar142 * fStack_10fc - fStack_12cc * fStack_111c) * local_1418._4_4_ +
               (fStack_12cc * fStack_110c - fStack_10fc * fVar72) * fVar140 +
               (fStack_111c * fVar72 - fStack_110c * fVar142) * fVar102;
          local_1308 = fVar141 + local_12f8 + auVar133._0_4_;
          fStack_1304 = fVar145 + fStack_12f4 + auVar133._4_4_;
          fStack_1300 = auVar122._8_4_ + fStack_12f0 + auVar133._8_4_;
          fStack_12fc = auVar122._12_4_ + fStack_12ec + auVar133._12_4_;
          auVar65._8_4_ = auVar122._8_4_;
          auVar65._0_8_ = auVar122._0_8_;
          auVar65._12_4_ = auVar122._12_4_;
          auVar22._4_4_ = fStack_12f4;
          auVar22._0_4_ = local_12f8;
          auVar22._8_4_ = fStack_12f0;
          auVar22._12_4_ = fStack_12ec;
          auVar115 = minps(auVar65,auVar22);
          auVar115 = minps(auVar115,auVar133);
          _local_12e8 = auVar122;
          auVar23._4_4_ = fStack_12f4;
          auVar23._0_4_ = local_12f8;
          auVar23._8_4_ = fStack_12f0;
          auVar23._12_4_ = fStack_12ec;
          auVar74 = maxps(auVar122,auVar23);
          auVar74 = maxps(auVar74,auVar133);
          fVar112 = ABS(local_1308) * 1.1920929e-07;
          fVar113 = ABS(fStack_1304) * 1.1920929e-07;
          fVar114 = ABS(fStack_1300) * 1.1920929e-07;
          fVar124 = ABS(fStack_12fc) * 1.1920929e-07;
          auVar123._4_4_ = -(uint)(auVar74._4_4_ <= fVar113);
          auVar123._0_4_ = -(uint)(auVar74._0_4_ <= fVar112);
          auVar123._8_4_ = -(uint)(auVar74._8_4_ <= fVar114);
          auVar123._12_4_ = -(uint)(auVar74._12_4_ <= fVar124);
          auVar66._4_4_ = -(uint)(-fVar113 <= auVar115._4_4_);
          auVar66._0_4_ = -(uint)(-fVar112 <= auVar115._0_4_);
          auVar66._8_4_ = -(uint)(-fVar114 <= auVar115._8_4_);
          auVar66._12_4_ = -(uint)(-fVar124 <= auVar115._12_4_);
          auVar123 = auVar123 | auVar66;
          iVar29 = movmskps(uVar45,auVar123);
          if (iVar29 != 0) {
            uVar45 = -(uint)(ABS(fVar144 * fVar128) <= ABS(local_1338 * fVar73));
            uVar47 = -(uint)(ABS(fVar146 * fVar129) <= ABS(fStack_1334 * fVar152));
            uVar51 = -(uint)(ABS(fVar147 * fVar130) <= ABS(fStack_1330 * fVar143));
            uVar54 = -(uint)(ABS(fVar148 * fVar142) <= ABS(fStack_132c * fVar155));
            uVar46 = -(uint)(ABS(fVar149 * fVar165) <= ABS(fVar161 * fVar144));
            uVar48 = -(uint)(ABS(fVar150 * fVar166) <= ABS(fVar162 * fVar146));
            uVar52 = -(uint)(ABS(fVar151 * fStack_12d0) <= ABS(fVar163 * fVar147));
            uVar55 = -(uint)(ABS(fVar160 * fStack_12cc) <= ABS(fVar164 * fVar148));
            uVar50 = -(uint)(ABS(fVar73 * fVar138) <= ABS(local_12c8 * fVar149));
            uVar49 = -(uint)(ABS(fVar152 * fVar57) <= ABS(fStack_12c4 * fVar150));
            uVar53 = -(uint)(ABS(fVar143 * fVar58) <= ABS(fStack_12c0 * fVar151));
            uVar56 = -(uint)(ABS(fVar155 * fVar72) <= ABS(fStack_12bc * fVar160));
            auVar99._0_4_ = (uint)(fVar73 * fVar165 - fVar144 * fVar128) & uVar45;
            auVar99._4_4_ = (uint)(fVar152 * fVar166 - fVar146 * fVar129) & uVar47;
            auVar99._8_4_ = (uint)(fVar143 * fStack_12d0 - fVar147 * fVar130) & uVar51;
            auVar99._12_4_ = (uint)(fVar155 * fStack_12cc - fVar148 * fVar142) & uVar54;
            auVar134._0_4_ = ~uVar45 & (uint)(local_12c8 * fVar144 - local_1338 * fVar73);
            auVar134._4_4_ = ~uVar47 & (uint)(fStack_12c4 * fVar146 - fStack_1334 * fVar152);
            auVar134._8_4_ = ~uVar51 & (uint)(fStack_12c0 * fVar147 - fStack_1330 * fVar143);
            auVar134._12_4_ = ~uVar54 & (uint)(fStack_12bc * fVar148 - fStack_132c * fVar155);
            _local_1288 = auVar134 | auVar99;
            local_1298._4_4_ = fStack_1304;
            local_1298._0_4_ = local_1308;
            local_1298._8_4_ = fStack_1300;
            local_1298._12_4_ = fStack_12fc;
            local_1278 = (float)(~uVar46 & (uint)(local_1338 * fVar149 - fVar161 * fVar144) |
                                (uint)(fVar144 * fVar138 - fVar149 * fVar165) & uVar46);
            fStack_1274 = (float)(~uVar48 & (uint)(fStack_1334 * fVar150 - fVar162 * fVar146) |
                                 (uint)(fVar146 * fVar57 - fVar150 * fVar166) & uVar48);
            fStack_1270 = (float)(~uVar52 & (uint)(fStack_1330 * fVar151 - fVar163 * fVar147) |
                                 (uint)(fVar147 * fVar58 - fVar151 * fStack_12d0) & uVar52);
            fStack_126c = (float)(~uVar55 & (uint)(fStack_132c * fVar160 - fVar164 * fVar148) |
                                 (uint)(fVar148 * fVar72 - fVar160 * fStack_12cc) & uVar55);
            auVar154._0_4_ = (uint)(fVar149 * fVar128 - fVar73 * fVar138) & uVar50;
            auVar154._4_4_ = (uint)(fVar150 * fVar129 - fVar152 * fVar57) & uVar49;
            auVar154._8_4_ = (uint)(fVar151 * fVar130 - fVar143 * fVar58) & uVar53;
            auVar154._12_4_ = (uint)(fVar160 * fVar142 - fVar155 * fVar72) & uVar56;
            auVar127._0_4_ = ~uVar50 & (uint)(fVar161 * fVar73 - local_12c8 * fVar149);
            auVar127._4_4_ = ~uVar49 & (uint)(fVar162 * fVar152 - fStack_12c4 * fVar150);
            auVar127._8_4_ = ~uVar53 & (uint)(fVar163 * fVar143 - fStack_12c0 * fVar151);
            auVar127._12_4_ = ~uVar56 & (uint)(fVar164 * fVar155 - fStack_12bc * fVar160);
            _local_1268 = auVar127 | auVar154;
            fVar155 = local_1418._4_4_ * local_1288._0_4_ +
                      fVar140 * local_1278 + fVar157 * local_1268._0_4_;
            fVar157 = local_1418._4_4_ * local_1288._4_4_ +
                      fVar140 * fStack_1274 + fVar90 * local_1268._4_4_;
            fVar90 = local_1418._4_4_ * local_1288._8_4_ +
                     fVar140 * fStack_1270 + fVar91 * local_1268._8_4_;
            fVar91 = local_1418._4_4_ * local_1288._12_4_ +
                     fVar140 * fStack_126c + fVar102 * local_1268._12_4_;
            fVar155 = fVar155 + fVar155;
            fVar157 = fVar157 + fVar157;
            fVar90 = fVar90 + fVar90;
            fVar91 = fVar91 + fVar91;
            auVar67._0_4_ = local_11c8 * local_1278 + (float)local_1378 * local_1268._0_4_;
            auVar67._4_4_ = fStack_11c4 * fStack_1274 + local_1378._4_4_ * local_1268._4_4_;
            auVar67._8_4_ = fStack_11c0 * fStack_1270 + fStack_1370 * local_1268._8_4_;
            auVar67._12_4_ = fStack_11bc * fStack_126c + fStack_136c * local_1268._12_4_;
            fVar72 = (float)local_11b8 * local_1288._0_4_ + auVar67._0_4_;
            fVar73 = local_11b8._4_4_ * local_1288._4_4_ + auVar67._4_4_;
            fVar152 = fStack_11b0 * local_1288._8_4_ + auVar67._8_4_;
            fVar143 = fStack_11ac * local_1288._12_4_ + auVar67._12_4_;
            auVar24._4_4_ = fVar157;
            auVar24._0_4_ = fVar155;
            auVar24._8_4_ = fVar90;
            auVar24._12_4_ = fVar91;
            auVar115 = rcpps(auVar67,auVar24);
            fVar138 = auVar115._0_4_;
            fVar140 = auVar115._4_4_;
            fVar57 = auVar115._8_4_;
            fVar58 = auVar115._12_4_;
            local_1408 = ((1.0 - fVar155 * fVar138) * fVar138 + fVar138) * (fVar72 + fVar72);
            fStack_1404 = ((1.0 - fVar157 * fVar140) * fVar140 + fVar140) * (fVar73 + fVar73);
            fStack_1400 = ((1.0 - fVar90 * fVar57) * fVar57 + fVar57) * (fVar152 + fVar152);
            fStack_13fc = ((1.0 - fVar91 * fVar58) * fVar58 + fVar58) * (fVar143 + fVar143);
            fVar138 = (ray->super_RayK<1>).tfar;
            uVar45 = (ray->super_RayK<1>).mask;
            fVar140 = (float)(ray->super_RayK<1>).id;
            fVar57 = (float)(ray->super_RayK<1>).flags;
            fVar58 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar68._4_4_ = -(uint)(fVar58 <= fStack_1404);
            auVar68._0_4_ = -(uint)(fVar58 <= local_1408);
            auVar68._8_4_ = -(uint)(fVar58 <= fStack_1400);
            auVar68._12_4_ = -(uint)(fVar58 <= fStack_13fc);
            local_1438 = auVar123._0_4_;
            uStack_1434 = auVar123._4_4_;
            uStack_1430 = auVar123._8_4_;
            uStack_142c = auVar123._12_4_;
            local_1258._0_4_ =
                 -(uint)(fVar155 != 0.0) & local_1438 &
                 -(uint)(local_1408 <= fVar138 && fVar58 <= local_1408);
            local_1258._4_4_ =
                 -(uint)(fVar157 != 0.0) & uStack_1434 &
                 -(uint)(fStack_1404 <= fVar138 && fVar58 <= fStack_1404);
            local_1258._8_4_ =
                 -(uint)(fVar90 != 0.0) & uStack_1430 &
                 -(uint)(fStack_1400 <= fVar138 && fVar58 <= fStack_1400);
            local_1258._12_4_ =
                 -(uint)(fVar91 != 0.0) & uStack_142c &
                 -(uint)(fStack_13fc <= fVar138 && fVar58 <= fStack_13fc);
            auVar25._4_4_ = local_1258._4_4_;
            auVar25._0_4_ = local_1258._0_4_;
            auVar25._8_4_ = local_1258._8_4_;
            auVar25._12_4_ = local_1258._12_4_;
            iVar29 = movmskps(iVar29,auVar25);
            if (iVar29 != 0) {
              fStack_12b0 = auVar122._8_4_;
              local_12b8 = (undefined1  [8])auVar122._0_8_;
              fStack_12ac = auVar122._12_4_;
              local_12a8 = local_12f8;
              fStack_12a4 = fStack_12f4;
              fStack_12a0 = fStack_12f0;
              fStack_129c = fStack_12ec;
              local_1228[0] = local_1408;
              local_1228[1] = fStack_1404;
              local_1228[2] = fStack_1400;
              local_1228[3] = fStack_13fc;
              local_11e8 = local_10d8._0_4_;
              uStack_11e4 = local_10d8._4_4_;
              uStack_11e0 = local_10d8._8_4_;
              uStack_11dc = local_10d8._12_4_;
              local_13f8._4_4_ = local_1258._4_4_;
              local_13f8._0_4_ = local_1258._0_4_;
              local_13f8._8_4_ = local_1258._8_4_;
              local_13f8._12_4_ = local_1258._12_4_;
              auVar115 = rcpps(auVar68,local_1298);
              fVar58 = auVar115._0_4_;
              fVar72 = auVar115._4_4_;
              fVar73 = auVar115._8_4_;
              fVar152 = auVar115._12_4_;
              fVar155 = (float)DAT_01f46a60;
              fVar157 = DAT_01f46a60._4_4_;
              fVar90 = DAT_01f46a60._12_4_;
              fVar143 = DAT_01f46a60._8_4_;
              fVar58 = (float)(-(uint)(1e-18 <= ABS(local_1308)) &
                              (uint)((fVar155 - local_1308 * fVar58) * fVar58 + fVar58));
              fVar72 = (float)(-(uint)(1e-18 <= ABS(fStack_1304)) &
                              (uint)((fVar157 - fStack_1304 * fVar72) * fVar72 + fVar72));
              fVar73 = (float)(-(uint)(1e-18 <= ABS(fStack_1300)) &
                              (uint)((fVar143 - fStack_1300 * fVar73) * fVar73 + fVar73));
              fVar152 = (float)(-(uint)(1e-18 <= ABS(fStack_12fc)) &
                               (uint)((fVar90 - fStack_12fc * fVar152) * fVar152 + fVar152));
              auVar137._0_4_ = fVar141 * fVar58;
              auVar137._4_4_ = fVar145 * fVar72;
              auVar137._8_4_ = auVar122._8_4_ * fVar73;
              auVar137._12_4_ = auVar122._12_4_ * fVar152;
              auVar74 = minps(auVar137,_DAT_01f46a60);
              auVar109._0_4_ = fVar58 * local_12f8;
              auVar109._4_4_ = fVar72 * fStack_12f4;
              auVar109._8_4_ = fVar73 * fStack_12f0;
              auVar109._12_4_ = fVar152 * fStack_12ec;
              auVar115 = minps(auVar109,_DAT_01f46a60);
              local_1248 = (float)((uint)auVar74._0_4_ & local_10e8._0_4_ |
                                  (uint)(fVar155 - auVar74._0_4_) & local_10d8._0_4_);
              uStack_1244 = (uint)auVar74._4_4_ & local_10e8._4_4_ |
                            (uint)(fVar157 - auVar74._4_4_) & local_10d8._4_4_;
              uStack_1240 = (uint)auVar74._8_4_ & local_10e8._8_4_ |
                            (uint)(fVar143 - auVar74._8_4_) & local_10d8._8_4_;
              uStack_123c = (uint)auVar74._12_4_ & local_10e8._12_4_ |
                            (uint)(fVar90 - auVar74._12_4_) & local_10d8._12_4_;
              auVar84._0_4_ = (uint)(fVar155 - auVar115._0_4_) & local_10d8._0_4_;
              auVar84._4_4_ = (uint)(fVar157 - auVar115._4_4_) & local_10d8._4_4_;
              auVar84._8_4_ = (uint)(fVar143 - auVar115._8_4_) & local_10d8._8_4_;
              auVar84._12_4_ = (uint)(fVar90 - auVar115._12_4_) & local_10d8._12_4_;
              auVar110._0_4_ = (uint)auVar115._0_4_ & local_10e8._0_4_;
              auVar110._4_4_ = (uint)auVar115._4_4_ & local_10e8._4_4_;
              auVar110._8_4_ = (uint)auVar115._8_4_ & local_10e8._8_4_;
              auVar110._12_4_ = (uint)auVar115._12_4_ & local_10e8._12_4_;
              local_1238 = auVar110 | auVar84;
              _local_1218 = _local_1288;
              local_1208[0] = local_1278;
              local_1208[1] = fStack_1274;
              local_1208[2] = fStack_1270;
              local_1208[3] = fStack_126c;
              _local_11f8 = _local_1268;
              auVar69._0_4_ = (uint)local_1408 & local_1258._0_4_;
              auVar69._4_4_ = (uint)fStack_1404 & local_1258._4_4_;
              auVar69._8_4_ = (uint)fStack_1400 & local_1258._8_4_;
              auVar69._12_4_ = (uint)fStack_13fc & local_1258._12_4_;
              auVar100._0_8_ = CONCAT44(~local_1258._4_4_,~local_1258._0_4_) & 0x7f8000007f800000;
              auVar100._8_4_ = ~local_1258._8_4_ & 0x7f800000;
              auVar100._12_4_ = ~local_1258._12_4_ & 0x7f800000;
              auVar100 = auVar100 | auVar69;
              auVar70._4_4_ = auVar100._0_4_;
              auVar70._0_4_ = auVar100._4_4_;
              auVar70._8_4_ = auVar100._12_4_;
              auVar70._12_4_ = auVar100._8_4_;
              auVar115 = minps(auVar70,auVar100);
              auVar85._0_8_ = auVar115._8_8_;
              auVar85._8_4_ = auVar115._0_4_;
              auVar85._12_4_ = auVar115._4_4_;
              auVar115 = minps(auVar85,auVar115);
              auVar86._0_4_ = -(uint)(auVar115._0_4_ == auVar100._0_4_) & local_1258._0_4_;
              auVar86._4_4_ = -(uint)(auVar115._4_4_ == auVar100._4_4_) & local_1258._4_4_;
              auVar86._8_4_ = -(uint)(auVar115._8_4_ == auVar100._8_4_) & local_1258._8_4_;
              auVar86._12_4_ = -(uint)(auVar115._12_4_ == auVar100._12_4_) & local_1258._12_4_;
              iVar29 = movmskps(iVar29,auVar86);
              uVar46 = local_1258._0_4_;
              uVar50 = local_1258._4_4_;
              uVar47 = local_1258._8_4_;
              uVar48 = local_1258._12_4_;
              if (iVar29 != 0) {
                uVar46 = auVar86._0_4_;
                uVar50 = auVar86._4_4_;
                uVar47 = auVar86._8_4_;
                uVar48 = auVar86._12_4_;
              }
              auVar26._4_4_ = uVar50;
              auVar26._0_4_ = uVar46;
              auVar26._8_4_ = uVar47;
              auVar26._12_4_ = uVar48;
              uVar31 = movmskps((int)pfVar34,auVar26);
              uVar36 = CONCAT44((int)((ulong)pfVar34 >> 0x20),uVar31);
              lVar37 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              local_1418 = context->scene;
              uVar46 = uVar45;
              fStack_140c = fStack_1410;
LAB_00584138:
              local_1350 = *(uint *)((long)auVar39 + lVar37 * 4);
              pRVar33 = (RTCIntersectArguments *)(ulong)local_1350;
              pGVar21 = (local_1418->geometries).items[(long)pRVar33].ptr;
              if ((pGVar21->mask & uVar46) == 0) {
                *(undefined4 *)(local_13f8 + lVar37 * 4) = 0;
              }
              else {
                pRVar35 = context->args;
                if (pRVar35->filter == (RTCFilterFunctionN)0x0) {
                  local_13a8.context = context->user;
                  if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar138 = (&local_1248)[lVar37];
                    fVar140 = local_1228[lVar37 + -4];
                    (ray->super_RayK<1>).tfar = local_1228[lVar37];
                    (ray->Ng).field_0.field_0.x = local_1208[lVar37 + -4];
                    (ray->Ng).field_0.field_0.y = local_1208[lVar37];
                    (ray->Ng).field_0.field_0.z = *(float *)(local_11f8 + lVar37 * 4);
                    ray->u = fVar138;
                    ray->v = fVar140;
                    ray->primID = *(uint *)(local_13b8 + 0x50 + lVar37 * 4);
                    ray->geomID = local_1350;
                    ray->instID[0] = (local_13a8.context)->instID[0];
                    ray->instPrimID[0] = (local_13a8.context)->instPrimID[0];
                    uVar36 = local_13b0;
                    goto LAB_005844a7;
                  }
                  fStack_1370 = fVar140;
                  fStack_136c = fVar57;
                }
                else {
                  fStack_1370 = fVar140;
                  fStack_136c = fVar57;
                  local_13a8.context = context->user;
                }
                local_1378 = CONCAT44(uVar45,fVar138);
                local_1368 = local_1208[lVar37 + -4];
                local_1364 = local_1208[lVar37];
                local_1360 = *(undefined4 *)(local_11f8 + lVar37 * 4);
                local_135c = (&local_1248)[lVar37];
                local_1358 = local_1228[lVar37 + -4];
                local_1354 = *(undefined4 *)(local_13b8 + 0x50 + lVar37 * 4);
                local_134c = (local_13a8.context)->instID[0];
                local_1348 = (local_13a8.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = local_1228[lVar37];
                local_141c = -1;
                local_13a8.valid = &local_141c;
                pRVar33 = (RTCIntersectArguments *)pGVar21->userPtr;
                local_13a8.geometryUserPtr = pRVar33;
                local_13a8.ray = (RTCRayN *)ray;
                local_13a8.hit = (RTCHitN *)&local_1368;
                local_13a8.N = 1;
                fStack_1370 = fVar140;
                fStack_136c = fVar57;
                if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00584328:
                  if (((pRVar35->filter != (RTCFilterFunctionN)0x0) &&
                      (((pRVar35->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                        RTC_RAY_QUERY_FLAG_INCOHERENT ||
                       (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) &&
                     ((*pRVar35->filter)(&local_13a8), pRVar33 = pRVar35, context = local_13c0,
                     ray = local_13c8, uVar41 = local_13d0, *local_13a8.valid == 0))
                  goto LAB_005843e3;
                  (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_13a8.hit;
                  (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_13a8.hit + 4);
                  (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_13a8.hit + 8);
                  *(float *)((long)local_13a8.ray + 0x3c) = *(float *)(local_13a8.hit + 0xc);
                  *(float *)((long)local_13a8.ray + 0x40) = *(float *)(local_13a8.hit + 0x10);
                  *(float *)((long)local_13a8.ray + 0x44) = *(float *)(local_13a8.hit + 0x14);
                  *(float *)((long)local_13a8.ray + 0x48) = *(float *)(local_13a8.hit + 0x18);
                  *(float *)((long)local_13a8.ray + 0x4c) = *(float *)(local_13a8.hit + 0x1c);
                  pRVar33 = (RTCIntersectArguments *)(ulong)(uint)*(float *)(local_13a8.hit + 0x20);
                  *(float *)((long)local_13a8.ray + 0x50) = *(float *)(local_13a8.hit + 0x20);
                }
                else {
                  local_13e8 = auVar39;
                  (*pGVar21->intersectionFilterN)(&local_13a8);
                  auVar39 = local_13e8;
                  context = local_13c0;
                  ray = local_13c8;
                  uVar41 = local_13d0;
                  if (*local_13a8.valid != 0) goto LAB_00584328;
LAB_005843e3:
                  (local_13c8->super_RayK<1>).tfar = (float)local_1378;
                  context = local_13c0;
                  ray = local_13c8;
                  uVar41 = local_13d0;
                }
                *(undefined4 *)(local_13f8 + lVar37 * 4) = 0;
                fVar138 = (ray->super_RayK<1>).tfar;
                uVar45 = (ray->super_RayK<1>).mask;
                fVar140 = (float)(ray->super_RayK<1>).id;
                fVar57 = (float)(ray->super_RayK<1>).flags;
                local_13f8._0_4_ = -(uint)(local_1408 <= fVar138) & local_13f8._0_4_;
                local_13f8._4_4_ = -(uint)(fStack_1404 <= fVar138) & local_13f8._4_4_;
                local_13f8._8_4_ = -(uint)(fStack_1400 <= fVar138) & local_13f8._8_4_;
                local_13f8._12_4_ = -(uint)(fStack_13fc <= fVar138) & local_13f8._12_4_;
                uVar46 = (ray->super_RayK<1>).mask;
              }
              iVar29 = movmskps((int)pRVar33,local_13f8);
              uVar36 = local_13b0;
              if (iVar29 == 0) goto LAB_005844a7;
              uVar50 = local_13f8._0_4_;
              uVar47 = local_13f8._4_4_;
              uVar48 = local_13f8._8_4_;
              uVar49 = local_13f8._12_4_;
              auVar87._0_4_ = uVar50 & (uint)local_1408;
              auVar87._4_4_ = uVar47 & (uint)fStack_1404;
              auVar87._8_4_ = uVar48 & (uint)fStack_1400;
              auVar87._12_4_ = uVar49 & (uint)fStack_13fc;
              auVar101._0_8_ = CONCAT44(~uVar47,~uVar50) & 0x7f8000007f800000;
              auVar101._8_4_ = ~uVar48 & 0x7f800000;
              auVar101._12_4_ = ~uVar49 & 0x7f800000;
              auVar101 = auVar101 | auVar87;
              auVar111._4_4_ = auVar101._0_4_;
              auVar111._0_4_ = auVar101._4_4_;
              auVar111._8_4_ = auVar101._12_4_;
              auVar111._12_4_ = auVar101._8_4_;
              auVar115 = minps(auVar111,auVar101);
              auVar88._0_8_ = auVar115._8_8_;
              auVar88._8_4_ = auVar115._0_4_;
              auVar88._12_4_ = auVar115._4_4_;
              auVar115 = minps(auVar88,auVar115);
              auVar89._0_8_ =
                   CONCAT44(-(uint)(auVar115._4_4_ == auVar101._4_4_) & uVar47,
                            -(uint)(auVar115._0_4_ == auVar101._0_4_) & uVar50);
              auVar89._8_4_ = -(uint)(auVar115._8_4_ == auVar101._8_4_) & uVar48;
              auVar89._12_4_ = -(uint)(auVar115._12_4_ == auVar101._12_4_) & uVar49;
              iVar29 = movmskps(iVar29,auVar89);
              auVar71 = local_13f8;
              if (iVar29 != 0) {
                auVar71._8_4_ = auVar89._8_4_;
                auVar71._0_8_ = auVar89._0_8_;
                auVar71._12_4_ = auVar89._12_4_;
              }
              uVar31 = movmskps(iVar29,auVar71);
              uVar36 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar31);
              lVar37 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              goto LAB_00584138;
            }
          }
LAB_005844a7:
          fVar138 = local_1078;
          fVar140 = fStack_1074;
          fVar73 = fStack_1070;
          fVar90 = fStack_106c;
          fVar57 = local_1098;
          fVar91 = fStack_1094;
          fVar102 = fStack_1090;
          fVar112 = fStack_108c;
          fVar58 = local_10a8;
          fVar113 = fStack_10a4;
          fVar114 = fStack_10a0;
          fVar124 = fStack_109c;
          fVar152 = local_10b8;
          fVar128 = fStack_10b4;
          fVar129 = fStack_10b0;
          fVar130 = fStack_10ac;
          fVar143 = local_11d8;
          fVar142 = fStack_11d4;
          fVar144 = fStack_11d0;
          fVar146 = fStack_11cc;
          fVar155 = local_1178;
          fVar147 = fStack_1174;
          fVar148 = fStack_1170;
          fVar149 = fStack_116c;
          fVar141 = local_1188;
          fVar150 = fStack_1184;
          fVar151 = fStack_1180;
          fVar160 = fStack_117c;
          fVar72 = local_1058;
          fVar161 = fStack_1054;
          fVar162 = fStack_1050;
          fVar163 = fStack_104c;
          fVar145 = local_1068;
          fVar164 = fStack_1064;
          fVar165 = fStack_1060;
          fVar166 = fStack_105c;
          fVar157 = local_1088;
          fVar156 = fStack_1084;
          fVar158 = fStack_1080;
          fVar159 = fStack_107c;
        }
        fVar27 = (ray->super_RayK<1>).tfar;
        auVar115._4_4_ = fVar27;
        auVar115._0_4_ = fVar27;
        auVar115._8_4_ = fVar27;
        auVar115._12_4_ = fVar27;
      }
      goto LAB_00582c81;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }